

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall socketsys::IOException::IOException(IOException *this,char *error,int code)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  char *pcStack_18;
  int code_local;
  char *error_local;
  IOException *this_local;
  
  local_1c = code;
  pcStack_18 = error;
  error_local = (char *)this;
  std::__cxx11::to_string(&local_60,code);
  std::operator+(&local_40,error,&local_60);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)this = &PTR__IOException_0018c9c8;
  return;
}

Assistant:

explicit IOException(const char* error, int code) : std::runtime_error(error + std::to_string(code)) {}